

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_fstore(jit_State *J)

{
  IRIns *pIVar1;
  IRRef1 IVar2;
  ushort uVar3;
  uint uVar4;
  AliasRet AVar5;
  TRef TVar6;
  IRIns *refa;
  IRIns *local_50;
  IRIns *ir;
  IRIns *store;
  IRRef1 *pIStack_38;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef fref;
  jit_State *J_local;
  
  uVar4 = (uint)(J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  refa = (J->cur).ir + uVar4;
  pIStack_38 = J->chain + 0x4d;
  uVar3 = *pIStack_38;
  while (store._4_4_ = (uint)uVar3, uVar4 < store._4_4_) {
    pIVar1 = (J->cur).ir + store._4_4_;
    AVar5 = aa_fref(J,refa,(J->cur).ir + (pIVar1->field_0).op1);
    if (AVar5 != ALIAS_NO) {
      if (AVar5 == ALIAS_MAY) {
        if ((pIVar1->field_0).op2 != IVar2) break;
      }
      else if (AVar5 == ALIAS_MUST) {
        if (((pIVar1->field_0).op2 == IVar2) &&
           (((refa->field_0).op2 < 0x10 || (0x15 < (refa->field_0).op2)))) {
          return 4;
        }
        if (J->chain[0x11] < store._4_4_) {
          local_50 = (J->cur).ir + ((J->cur).nins - 1);
          goto LAB_001a6b6d;
        }
        break;
      }
    }
    pIStack_38 = &(pIVar1->field_0).prev;
    uVar3 = (pIVar1->field_0).prev;
  }
LAB_001a6c19:
  TVar6 = lj_ir_emit(J);
  return TVar6;
LAB_001a6b6d:
  if (local_50 <= pIVar1) goto LAB_001a6bbc;
  if ((((local_50->field_1).t.irt & 0x80) != 0) ||
     (((local_50->field_1).o == 'E' && ((local_50->field_0).op2 == (refa->field_0).op2))))
  goto LAB_001a6c19;
  local_50 = local_50 + -1;
  goto LAB_001a6b6d;
LAB_001a6bbc:
  *pIStack_38 = (pIVar1->field_0).prev;
  (pIVar1->field_0).ot = 0xc00;
  (pIVar1->field_0).op2 = 0;
  (pIVar1->field_0).op1 = 0;
  (pIVar1->field_0).prev = 0;
  goto LAB_001a6c19;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val &&
	  !(xr->op2 >= IRFL_SBUF_W && xr->op2 <= IRFL_SBUF_R))
	return DROPFOLD;  /* Same value: drop the new store. */
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}